

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O3

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::Object>,_embree::sse2::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
         BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::Object>,_embree::sse2::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
         *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc,bool toplevel)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  FastAllocator *pFVar6;
  tuple<embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  this_00;
  iterator __position;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  undefined1 auVar7 [8];
  BVHNodeRecord<embree::NodeRefPtr<4>_> *pBVar8;
  char cVar9;
  long *plVar10;
  ThreadLocal2 *this_01;
  BuildPrim *pBVar11;
  undefined1 (*pauVar12) [16];
  int *piVar13;
  size_t sVar14;
  runtime_error *this_02;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  MutexSys *pMVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  size_type sVar24;
  uint uVar25;
  ulong uVar26;
  MutexSys *pMVar27;
  char *pcVar28;
  size_t *psVar29;
  range<unsigned_int> *prVar30;
  task_group_context context;
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  auto_partitioner local_2f9;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  undefined8 uStack_2e0;
  MutexSys *local_2d8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_2d0;
  size_t local_2c8;
  blocked_range<unsigned_long> local_2c0;
  range<unsigned_int> local_2a8;
  range<unsigned_int> local_2a0 [7];
  undefined1 local_268 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_248 [2];
  string_resource_index local_228;
  anon_class_32_4_e5015336 local_1e0;
  anon_class_8_1_898bcfc2 local_1c0;
  ThreadLocal2 local_1b8 [2];
  
  uStack_2e0 = local_2e8;
  local_2f8._8_8_ = local_2f8._0_8_;
  local_2f8._0_8_ = current;
  local_2d0 = __return_storage_ptr__;
  local_2c8 = depth;
  if (alloc.alloc == (FastAllocator *)0x0) {
    pFVar6 = (this->createAllocator->super_Create).allocator;
    plVar10 = (long *)__tls_get_addr(&PTR_021a7d38);
    this_01 = (ThreadLocal2 *)*plVar10;
    local_2e8 = (undefined1  [8])pFVar6;
    if (this_01 == (ThreadLocal2 *)0x0) {
      this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
      MutexSys::MutexSys((MutexSys *)this_01);
      (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
      (this_01->alloc0).parent = this_01;
      (this_01->alloc0).ptr = (char *)0x0;
      (this_01->alloc0).cur = 0;
      (this_01->alloc0).end = 0;
      (this_01->alloc0).allocBlockSize = 0;
      (this_01->alloc0).bytesUsed = 0;
      (this_01->alloc0).bytesWasted = 0;
      (this_01->alloc1).parent = this_01;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      *plVar10 = (long)this_01;
      local_1b8[0].mutex.mutex = &FastAllocator::s_thread_local_allocators_lock;
      local_1b8[0].alloc._M_b._M_p._0_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_268._0_8_ = this_01;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)local_268);
      if ((ThreadLocal2 *)local_268._0_8_ != (ThreadLocal2 *)0x0) {
        std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                  ((default_delete<embree::FastAllocator::ThreadLocal2> *)local_268,
                   (ThreadLocal2 *)local_268._0_8_);
      }
      MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    }
    alloc.talloc0 = &this_01->alloc0;
    alloc.talloc1 = &this_01->alloc1;
    if (((FastAllocator *)local_2e8)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
    current = (range<unsigned_int> *)local_2f8._0_8_;
    alloc.alloc = (FastAllocator *)local_2e8;
  }
  local_2e8 = (undefined1  [8])alloc.alloc;
  if ((toplevel) &&
     ((ulong)(current->_end - current->_begin) <= (this->super_Settings).singleThreadThreshold)) {
    (**(this->progressMonitor->super_BuildProgressMonitor)._vptr_BuildProgressMonitor)();
    current = (range<unsigned_int> *)local_2f8._0_8_;
  }
  pBVar8 = local_2d0;
  if ((this->super_Settings).maxDepth <= depth + 8) {
LAB_00beaf0c:
    alloc_01.talloc0 = alloc.talloc0;
    alloc_01.alloc = alloc.alloc;
    alloc_01.talloc1 = alloc.talloc1;
    createLargeLeaf(local_2d0,this,depth,current,alloc_01);
    return pBVar8;
  }
  uVar21 = (ulong)current->_begin;
  uVar22 = current->_end;
  uVar19 = (ulong)uVar22;
  if ((ulong)(uVar22 - current->_begin) <= (this->super_Settings).minLeafSize) goto LAB_00beaf0c;
  pBVar11 = this->morton;
  uVar25 = pBVar11[uVar21].field_0.field_0.code;
  uVar22 = pBVar11[uVar22 - 1].field_0.field_0.code;
  if (uVar25 == uVar22) {
LAB_00beaf30:
    recreateMortonCodes(this,current);
    pBVar11 = this->morton;
    uVar22 = *(uint *)local_2f8._0_8_;
    uVar21 = (ulong)uVar22;
    uVar25 = *(uint *)(local_2f8._0_8_ + 4);
    uVar19 = (ulong)uVar25;
    uVar5 = pBVar11[uVar21].field_0.field_0.code;
    uVar23 = pBVar11[uVar25 - 1].field_0.field_0.code;
    current = (range<unsigned_int> *)local_2f8._0_8_;
    if (uVar5 != uVar23) {
      uVar23 = uVar23 ^ uVar5;
      iVar15 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> iVar15 == 0; iVar15 = iVar15 + -1) {
        }
      }
      if (iVar15 != -1) goto LAB_00bea920;
    }
    uVar25 = uVar22 + uVar25 >> 1;
    uVar18 = (ulong)uVar25;
    local_2a8._end = uVar25;
    local_2a8._begin = uVar22;
  }
  else {
    uVar22 = uVar22 ^ uVar25;
    iVar15 = 0x1f;
    if (uVar22 != 0) {
      for (; uVar22 >> iVar15 == 0; iVar15 = iVar15 + -1) {
      }
    }
    if (iVar15 == -1) goto LAB_00beaf30;
LAB_00bea920:
    uVar22 = (uint)uVar19;
    uVar18 = uVar21;
    uVar26 = uVar19;
    if ((int)uVar21 + 1U != uVar22) {
      do {
        uVar22 = (uint)((int)uVar26 + (int)uVar18) >> 1;
        uVar17 = (ulong)uVar22;
        if ((pBVar11[uVar22].field_0.field_0.code & 0x80000000U >> (~(byte)iVar15 & 0x1f)) == 0) {
          uVar18 = (ulong)uVar22;
          uVar17 = uVar26;
        }
        uVar22 = (uint)uVar17;
        uVar26 = uVar17;
      } while ((int)uVar18 + 1U != uVar22);
    }
    uVar18 = (ulong)uVar22;
    local_2a8 = (range<unsigned_int>)(uVar21 | uVar18 << 0x20);
  }
  local_2a0[0] = (range<unsigned_int>)(uVar19 << 0x20 | uVar18);
  pMVar27 = (MutexSys *)0x2;
  if (2 < (this->super_Settings).branchingFactor) {
    do {
      uVar21 = 0;
      uVar19 = 0xffffffff;
      uVar22 = 0;
      do {
        uVar25 = (&local_2a8)[uVar21]._end - local_2a0[uVar21 - 1]._begin;
        if ((this->super_Settings).minLeafSize < (ulong)uVar25 && uVar22 < uVar25) {
          uVar19 = uVar21 & 0xffffffff;
          uVar22 = uVar25;
        }
        uVar21 = uVar21 + 1;
      } while ((MutexSys *)(uVar21 & 0xffffffff) < pMVar27);
      iVar15 = (int)uVar19;
      if (iVar15 == -1) break;
      prVar30 = local_2a0 + (long)iVar15 + -1;
      uVar21 = (ulong)prVar30->_begin;
      uVar19 = (ulong)(&local_2a8)[iVar15]._end;
      uVar22 = pBVar11[uVar21].field_0.field_0.code;
      uVar25 = pBVar11[(&local_2a8)[iVar15]._end - 1].field_0.field_0.code;
      if (uVar22 == uVar25) {
LAB_00beaa63:
        recreateMortonCodes(this,prVar30);
        pBVar11 = this->morton;
        uVar22 = prVar30->_begin;
        uVar21 = (ulong)uVar22;
        uVar25 = (&local_2a8)[iVar15]._end;
        uVar19 = (ulong)uVar25;
        uVar5 = pBVar11[uVar21].field_0.field_0.code;
        uVar23 = pBVar11[uVar25 - 1].field_0.field_0.code;
        current = (range<unsigned_int> *)local_2f8._0_8_;
        if (uVar5 != uVar23) {
          uVar23 = uVar23 ^ uVar5;
          iVar16 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> iVar16 == 0; iVar16 = iVar16 + -1) {
            }
          }
          if (iVar16 != -1) goto LAB_00bea9f6;
        }
        uVar25 = uVar22 + uVar25 >> 1;
        uVar18 = (ulong)uVar25;
        sVar24 = CONCAT44(uVar25,uVar22);
      }
      else {
        uVar25 = uVar25 ^ uVar22;
        iVar16 = 0x1f;
        if (uVar25 != 0) {
          for (; uVar25 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        if (iVar16 == -1) goto LAB_00beaa63;
LAB_00bea9f6:
        uVar22 = (uint)uVar19;
        uVar18 = uVar19;
        uVar26 = uVar21;
        if ((int)uVar21 + 1U != uVar22) {
          do {
            uVar17 = (ulong)((uint)((int)uVar18 + (int)uVar26) >> 1);
            if ((pBVar11[uVar17].field_0.field_0.code & 0x80000000U >> (~(byte)iVar16 & 0x1f)) != 0)
            {
              uVar18 = uVar17;
              uVar17 = uVar26;
            }
            uVar22 = (uint)uVar18;
            uVar26 = uVar17;
          } while ((int)uVar17 + 1U != uVar22);
        }
        uVar18 = (ulong)uVar22;
        sVar24 = uVar21 | uVar18 << 0x20;
      }
      *prVar30 = *(range<unsigned_int> *)(&local_2c0.my_grainsize + (long)pMVar27);
      (&local_2c0.my_grainsize)[(long)pMVar27] = sVar24;
      local_2a0[(long)((long)&pMVar27[-1].mutex + 7)] =
           (range<unsigned_int>)(uVar19 << 0x20 | uVar18);
      pMVar27 = (MutexSys *)((long)&pMVar27->mutex + 1);
    } while (pMVar27 < (MutexSys *)(this->super_Settings).branchingFactor);
  }
  local_2c0.my_end = 0x80;
  this_00.
  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
  .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
        )(alloc.talloc0)->parent;
  if (local_2e8 !=
      (undefined1  [8])
      (((atomic<embree::FastAllocator_*> *)
       ((long)this_00.
              super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
              .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8)
       )->_M_b)._M_p) {
    local_268[8] = '\x01';
    local_268._0_8_ =
         this_00.
         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    MutexSys::lock((MutexSys *)
                   this_00.
                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                   .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl
                  );
    if ((((atomic<embree::FastAllocator_*> *)
         ((long)this_00.
                super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl +
         8))->_M_b)._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0xa8) +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x68);
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((long)*(void **)((long)this_00.
                                    super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                    .
                                    super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                    ._M_head_impl + 0x58) +
            (long)*(void **)((long)this_00.
                                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   .
                                   super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                   ._M_head_impl + 0x98)) -
           ((long)*(void **)((long)this_00.
                                   super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                   .
                                   super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                   ._M_head_impl + 0x50) +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x90)));
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)
                  ((long)this_00.
                         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                         _M_head_impl + 8))->_M_b)._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0xb0) +
           (long)*(void **)((long)this_00.
                                  super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                                  .
                                  super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>
                                  ._M_head_impl + 0x70);
      UNLOCK();
    }
    *(void **)((long)this_00.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x68) = (void *)0x0;
    *(void **)((long)this_00.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x70) = (void *)0x0;
    *(void **)((long)this_00.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x58) = (void *)0x0;
    *(void **)((long)this_00.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x60) = (void *)0x0;
    *(void **)((long)this_00.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x48) = (void *)0x0;
    *(void **)((long)this_00.
                     super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                     _M_head_impl + 0x50) = (void *)0x0;
    auVar7 = local_2e8;
    if (local_2e8 == (undefined1  [8])0x0) {
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa8) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xb0) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x98) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x88) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x90) = (void *)0x0;
    }
    else {
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x60) = *(void **)((long)local_2e8 + 0x10);
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x88) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x90) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0x98) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa8) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xb0) = (void *)0x0;
      *(void **)((long)this_00.
                       super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                       .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>.
                       _M_head_impl + 0xa0) = *(void **)((long)local_2e8 + 0x10);
    }
    LOCK();
    (((atomic<embree::FastAllocator_*> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
            .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl + 8))
    ->_M_b)._M_p = (__pointer_type)local_2e8;
    UNLOCK();
    local_1b8[0].mutex.mutex = &FastAllocator::s_thread_local_allocators_lock;
    local_1b8[0].alloc._M_b._M_p._0_1_ = 1;
    local_1e0.bounds =
         (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])
         this_00.
         super__Tuple_impl<0UL,_embree::FastAllocator::ThreadLocal2_*,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
         .super__Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false>._M_head_impl;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (((vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            *)((long)auVar7 + 0x130))->
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (((vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           *)((long)auVar7 + 0x130))->
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)((long)auVar7 + 0x130),__position,(ThreadLocal2 **)&local_1e0);
      if (((byte)local_1b8[0].alloc._M_b._M_p & 1) != 0) goto LAB_00beac0e;
    }
    else {
      *__position._M_current = (ThreadLocal2 *)local_1e0.bounds;
      pppTVar2 = &(((vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                     *)((long)auVar7 + 0x130))->
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
LAB_00beac0e:
      MutexSys::unlock((MutexSys *)local_1b8[0].mutex.mutex);
    }
    if (local_268[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_268._0_8_);
    }
    current = (range<unsigned_int> *)local_2f8._0_8_;
  }
  (alloc.talloc0)->bytesUsed = (long)(void **)local_2c0.my_end + (alloc.talloc0)->bytesUsed;
  sVar14 = (alloc.talloc0)->cur;
  uVar19 = (ulong)(-(int)sVar14 & 0xf);
  uVar21 = (long)(void **)local_2c0.my_end + uVar19 + sVar14;
  (alloc.talloc0)->cur = uVar21;
  local_2d8 = pMVar27;
  if (uVar21 <= (alloc.talloc0)->end) {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar19;
    pcVar28 = (alloc.talloc0)->ptr + (uVar21 - local_2c0.my_end);
    goto LAB_00beac70;
  }
  (alloc.talloc0)->cur = sVar14;
  if ((MutexSys *)(alloc.talloc0)->allocBlockSize < (MutexSys *)(local_2c0.my_end << 2)) {
    pcVar28 = (char *)FastAllocator::malloc((FastAllocator *)local_2e8,(size_t)&local_2c0);
  }
  else {
    local_1b8[0].mutex.mutex = (MutexSys *)(alloc.talloc0)->allocBlockSize;
    pcVar28 = (char *)FastAllocator::malloc((FastAllocator *)local_2e8,(size_t)local_1b8);
    (alloc.talloc0)->ptr = pcVar28;
    sVar14 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
    (alloc.talloc0)->bytesWasted = sVar14;
    (alloc.talloc0)->end = (size_t)local_1b8[0].mutex.mutex;
    (alloc.talloc0)->cur = local_2c0.my_end;
    if (local_1b8[0].mutex.mutex < local_2c0.my_end) {
      (alloc.talloc0)->cur = 0;
      local_1b8[0].mutex.mutex = (void *)(alloc.talloc0)->allocBlockSize;
      pcVar28 = (char *)FastAllocator::malloc((FastAllocator *)local_2e8,(size_t)local_1b8);
      (alloc.talloc0)->ptr = pcVar28;
      sVar14 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar14;
      (alloc.talloc0)->end = (size_t)local_1b8[0].mutex.mutex;
      (alloc.talloc0)->cur = local_2c0.my_end;
      if (local_1b8[0].mutex.mutex < local_2c0.my_end) {
        (alloc.talloc0)->cur = 0;
        pcVar28 = (char *)0x0;
        goto LAB_00beaff9;
      }
    }
    (alloc.talloc0)->bytesWasted = sVar14;
  }
LAB_00beaff9:
  current = (range<unsigned_int> *)local_2f8._0_8_;
LAB_00beac70:
  pcVar28[0x60] = '\0';
  pcVar28[0x61] = '\0';
  pcVar28[0x62] = -0x80;
  pcVar28[99] = '\x7f';
  pcVar28[100] = '\0';
  pcVar28[0x65] = '\0';
  pcVar28[0x66] = -0x80;
  pcVar28[0x67] = '\x7f';
  pcVar28[0x68] = '\0';
  pcVar28[0x69] = '\0';
  pcVar28[0x6a] = -0x80;
  pcVar28[0x6b] = '\x7f';
  pcVar28[0x6c] = '\0';
  pcVar28[0x6d] = '\0';
  pcVar28[0x6e] = -0x80;
  pcVar28[0x6f] = '\x7f';
  pcVar28[0x40] = '\0';
  pcVar28[0x41] = '\0';
  pcVar28[0x42] = -0x80;
  pcVar28[0x43] = '\x7f';
  pcVar28[0x44] = '\0';
  pcVar28[0x45] = '\0';
  pcVar28[0x46] = -0x80;
  pcVar28[0x47] = '\x7f';
  pcVar28[0x48] = '\0';
  pcVar28[0x49] = '\0';
  pcVar28[0x4a] = -0x80;
  pcVar28[0x4b] = '\x7f';
  pcVar28[0x4c] = '\0';
  pcVar28[0x4d] = '\0';
  pcVar28[0x4e] = -0x80;
  pcVar28[0x4f] = '\x7f';
  pcVar28[0x20] = '\0';
  pcVar28[0x21] = '\0';
  pcVar28[0x22] = -0x80;
  pcVar28[0x23] = '\x7f';
  pcVar28[0x24] = '\0';
  pcVar28[0x25] = '\0';
  pcVar28[0x26] = -0x80;
  pcVar28[0x27] = '\x7f';
  pcVar28[0x28] = '\0';
  pcVar28[0x29] = '\0';
  pcVar28[0x2a] = -0x80;
  pcVar28[0x2b] = '\x7f';
  pcVar28[0x2c] = '\0';
  pcVar28[0x2d] = '\0';
  pcVar28[0x2e] = -0x80;
  pcVar28[0x2f] = '\x7f';
  pcVar28[0x70] = '\0';
  pcVar28[0x71] = '\0';
  pcVar28[0x72] = -0x80;
  pcVar28[0x73] = -1;
  pcVar28[0x74] = '\0';
  pcVar28[0x75] = '\0';
  pcVar28[0x76] = -0x80;
  pcVar28[0x77] = -1;
  pcVar28[0x78] = '\0';
  pcVar28[0x79] = '\0';
  pcVar28[0x7a] = -0x80;
  pcVar28[0x7b] = -1;
  pcVar28[0x7c] = '\0';
  pcVar28[0x7d] = '\0';
  pcVar28[0x7e] = -0x80;
  pcVar28[0x7f] = -1;
  pcVar28[0x50] = '\0';
  pcVar28[0x51] = '\0';
  pcVar28[0x52] = -0x80;
  pcVar28[0x53] = -1;
  pcVar28[0x54] = '\0';
  pcVar28[0x55] = '\0';
  pcVar28[0x56] = -0x80;
  pcVar28[0x57] = -1;
  pcVar28[0x58] = '\0';
  pcVar28[0x59] = '\0';
  pcVar28[0x5a] = -0x80;
  pcVar28[0x5b] = -1;
  pcVar28[0x5c] = '\0';
  pcVar28[0x5d] = '\0';
  pcVar28[0x5e] = -0x80;
  pcVar28[0x5f] = -1;
  pcVar28[0x30] = '\0';
  pcVar28[0x31] = '\0';
  pcVar28[0x32] = -0x80;
  pcVar28[0x33] = -1;
  pcVar28[0x34] = '\0';
  pcVar28[0x35] = '\0';
  pcVar28[0x36] = -0x80;
  pcVar28[0x37] = -1;
  pcVar28[0x38] = '\0';
  pcVar28[0x39] = '\0';
  pcVar28[0x3a] = -0x80;
  pcVar28[0x3b] = -1;
  pcVar28[0x3c] = '\0';
  pcVar28[0x3d] = '\0';
  pcVar28[0x3e] = -0x80;
  pcVar28[0x3f] = -1;
  pcVar28[0] = '\b';
  pcVar28[1] = '\0';
  pcVar28[2] = '\0';
  pcVar28[3] = '\0';
  pcVar28[4] = '\0';
  pcVar28[5] = '\0';
  pcVar28[6] = '\0';
  pcVar28[7] = '\0';
  pcVar28[8] = '\b';
  pcVar28[9] = '\0';
  pcVar28[10] = '\0';
  pcVar28[0xb] = '\0';
  pcVar28[0xc] = '\0';
  pcVar28[0xd] = '\0';
  pcVar28[0xe] = '\0';
  pcVar28[0xf] = '\0';
  pcVar28[0x10] = '\b';
  pcVar28[0x11] = '\0';
  pcVar28[0x12] = '\0';
  pcVar28[0x13] = '\0';
  pcVar28[0x14] = '\0';
  pcVar28[0x15] = '\0';
  pcVar28[0x16] = '\0';
  pcVar28[0x17] = '\0';
  pcVar28[0x18] = '\b';
  pcVar28[0x19] = '\0';
  pcVar28[0x1a] = '\0';
  pcVar28[0x1b] = '\0';
  pcVar28[0x1c] = '\0';
  pcVar28[0x1d] = '\0';
  pcVar28[0x1e] = '\0';
  pcVar28[0x1f] = '\0';
  if ((this->super_Settings).singleThreadThreshold < (ulong)(current->_end - current->_begin)) {
    local_1e0.bounds = (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])local_1b8;
    local_1e0.depth = &local_2c8;
    local_1e0.children = (range<unsigned_int> (*) [8])&local_2a8;
    local_268[0xc] = proxy_support;
    local_268[0xd] = (context_traits)0x4;
    local_248[0]._0_8_ = (intrusive_list_node *)0x0;
    local_248[0]._8_8_ = (intrusive_list_node *)0x0;
    local_228 = CUSTOM_CTX;
    local_1e0.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::r1::initialize((task_group_context *)local_268);
    local_2c0.my_end = (unsigned_long)local_2d8;
    local_2c0.my_begin = 0;
    local_2c0.my_grainsize = 1;
    local_1c0.func = &local_1e0;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_2c0,&local_1c0,&local_2f9,(task_group_context *)local_268);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_268);
    if (cVar9 != '\0') {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"task cancelled");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_268);
  }
  else {
    local_2e8 = (undefined1  [8])(local_2c8 + 1);
    prVar30 = &local_2a8;
    psVar29 = (size_t *)&local_1b8[0].field_0x20;
    pMVar27 = local_2d8;
    do {
      alloc_00.talloc0 = alloc.talloc0;
      alloc_00.alloc = alloc.alloc;
      alloc_00.talloc1 = alloc.talloc1;
      recurse((BVHNodeRecord<embree::NodeRefPtr<4>_> *)local_268,this,(size_t)local_2e8,prVar30,
              alloc_00,false);
      (((ThreadLocal2 *)(psVar29 + -4))->mutex).mutex = (void *)local_268._0_8_;
      *(undefined8 *)(psVar29 + -2) = local_268._16_8_;
      psVar29[-1] = local_268._24_8_;
      *psVar29 = local_248[0]._0_8_;
      psVar29[1] = local_248[0]._8_8_;
      psVar29 = psVar29 + 6;
      prVar30 = prVar30 + 1;
      pMVar27 = (MutexSys *)((long)&pMVar27[-1].mutex + 7);
    } while (pMVar27 != (MutexSys *)0x0);
  }
  pBVar8 = local_2d0;
  pMVar27 = local_2d8;
  pauVar12 = (undefined1 (*) [16])&local_1b8[0].field_0x20;
  pMVar20 = (MutexSys *)0x0;
  _local_2e8 = _DAT_01f7a9f0;
  local_2f8 = _DAT_01f7aa00;
  do {
    auVar3 = pauVar12[-1];
    auVar4 = *pauVar12;
    _local_2e8 = minps(_local_2e8,auVar3);
    local_2f8 = maxps(local_2f8,auVar4);
    *(undefined8 *)(pcVar28 + (long)pMVar20 * 8) = *(undefined8 *)pauVar12[-2];
    *(int *)(pcVar28 + (long)pMVar20 * 4 + 0x20) = auVar3._0_4_;
    *(int *)(pcVar28 + (long)pMVar20 * 4 + 0x40) = auVar3._4_4_;
    *(int *)(pcVar28 + (long)pMVar20 * 4 + 0x60) = auVar3._8_4_;
    *(int *)(pcVar28 + (long)pMVar20 * 4 + 0x30) = auVar4._0_4_;
    *(int *)(pcVar28 + (long)pMVar20 * 4 + 0x50) = auVar4._4_4_;
    *(int *)(pcVar28 + (long)pMVar20 * 4 + 0x70) = auVar4._8_4_;
    pMVar20 = (MutexSys *)((long)&pMVar20->mutex + 1);
    pauVar12 = pauVar12 + 3;
  } while (local_2d8 != pMVar20);
  piVar13 = (int *)&local_1b8[0].field_0x1c;
  uVar19 = 0;
  pMVar20 = local_2d8;
  do {
    uVar19 = uVar19 + (long)*piVar13;
    piVar13 = piVar13 + 0xc;
    pMVar20 = (MutexSys *)((long)&pMVar20[-1].mutex + 7);
  } while (pMVar20 != (MutexSys *)0x0);
  if (0xfff < uVar19) {
    piVar13 = (int *)&local_1b8[0].field_0x1c;
    pMVar20 = (MutexSys *)0x0;
    do {
      if (*piVar13 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar28 + (long)pMVar20 * 8),1);
        pcVar28[(long)pMVar20 * 8 + 7] = pcVar28[(long)pMVar20 * 8 + 7] | 0x80;
      }
      pMVar20 = (MutexSys *)((long)&pMVar20->mutex + 1);
      piVar13 = piVar13 + 0xc;
    } while (pMVar27 != pMVar20);
  }
  (pBVar8->ref).ptr = (size_t)pcVar28;
  (pBVar8->bounds).lower.field_0.m128[0] = (float)local_2e8._0_4_;
  (pBVar8->bounds).lower.field_0.m128[1] = (float)local_2e8._4_4_;
  (pBVar8->bounds).lower.field_0.m128[2] = (float)uStack_2e0;
  (pBVar8->bounds).lower.field_0.m128[3] = (float)uVar19;
  *(undefined8 *)&(pBVar8->bounds).upper.field_0 = local_2f8._0_8_;
  *(undefined8 *)((long)&(pBVar8->bounds).upper.field_0 + 8) = local_2f8._8_8_;
  return pBVar8;
}

Assistant:

ReductionTy recurse(size_t depth, const range<unsigned>& current, Allocator alloc, bool toplevel)
        {
          /* get thread local allocator */
          if (!alloc)
            alloc = createAllocator();

          /* call memory monitor function to signal progress */
          if (toplevel && current.size() <= singleThreadThreshold)
            progressMonitor(current.size());

          /* create leaf node */
          if (unlikely(depth+MIN_LARGE_LEAF_LEVELS >= maxDepth || current.size() <= minLeafSize))
            return createLargeLeaf(depth,current,alloc);

          /* fill all children by always splitting the one with the largest surface area */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          split(current,children[0],children[1]);
          size_t numChildren = 2;

          while (numChildren < branchingFactor)
          {
            /* find best child with largest number of primitives */
            int bestChild = -1;
            unsigned bestItems = 0;
            for (unsigned int i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= minLeafSize)
                continue;

              /* remember child with largest area */
              if (children[i].size() > bestItems) {
                bestItems = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == -1) break;

            /*! split best child into left and right child */
            range<unsigned> left, right;
            split(children[bestChild],left,right);

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = left;
            children[numChildren+0] = right;
            numChildren++;
          }

          /* create leaf node if no split is possible */
          if (unlikely(numChildren == 1))
            return createLeaf(current,alloc);

          /* allocate node */
          auto node = createNode(alloc,numChildren);

          /* process top parts of tree parallel */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          if (current.size() > singleThreadThreshold)
          {
            /*! parallel_for is faster than spawning sub-tasks */
            parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  bounds[i] = recurse(depth+1,children[i],nullptr,true);
                  _mm_mfence(); // to allow non-temporal stores during build
                }
              });
          }

          /* finish tree sequentially */
          else
          {
            for (size_t i=0; i<numChildren; i++)
              bounds[i] = recurse(depth+1,children[i],alloc,false);
          }

          return setBounds(node,bounds,numChildren);
        }